

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.hpp
# Opt level: O0

optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>
unodb::detail::impl_helpers::
remove_or_choose_subtree<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::detail::inode_256<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
          (inode_256<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *inode,
          byte key_byte,basic_art_key<unsigned_long> k,
          db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *db_instance,
          node_ptr *node_in_parent)

{
  node_type nVar1;
  bool bVar2;
  byte *args_1;
  basic_leaf<unsigned_long,_unodb::detail::node_header> *this;
  header_type *ptr;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar3;
  find_result fVar4;
  optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*> oVar5;
  void *local_a8;
  void *local_a0;
  basic_node_ptr<unodb::detail::node_header> local_98;
  undefined1 local_90 [8];
  db_inode_unique_ptr<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte>_>_> new_node
  ;
  basic_leaf<unsigned_long,_unodb::detail::node_header> *leaf;
  basic_node_ptr<unodb::detail::node_header> local_68;
  basic_node_ptr<unodb::detail::node_header> child_ptr_val;
  type *child_ptr;
  type *child_i;
  in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_> *local_48;
  node_ptr *local_40;
  node_ptr *node_in_parent_local;
  db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *db_instance_local;
  basic_inode_256<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
  *pbStack_28;
  byte key_byte_local;
  inode_256<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *inode_local;
  basic_art_key<unsigned_long> k_local;
  bool local_10;
  
  local_40 = node_in_parent;
  node_in_parent_local = &db_instance->root;
  db_instance_local._7_1_ = key_byte;
  pbStack_28 = &inode->super_inode_256_parent<unsigned_long,_std::span<const_std::byte>_>;
  inode_local = (inode_256<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)
                k.field_0;
  fVar4 = basic_inode_256<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
          ::find_child(&inode->super_inode_256_parent<unsigned_long,_std::span<const_std::byte>_>,
                       key_byte);
  local_48 = fVar4.second;
  child_i._0_1_ = fVar4.first;
  args_1 = std::
           get<0ul,unsigned_char,unodb::in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>>*>
                     ((pair<unsigned_char,_unodb::in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_>_*>
                       *)&child_i);
  child_ptr_val.tagged_ptr =
       (uintptr_t)
       std::
       get<1ul,unsigned_char,unodb::in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>>*>
                 ((pair<unsigned_char,_unodb::in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_>_*>
                   *)&child_i);
  if (*(type *)child_ptr_val.tagged_ptr == (type)0x0) {
    std::optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>::optional
              ((optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*> *)&k_local);
    uVar3 = extraout_RDX;
  }
  else {
    local_68 = in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_>
               ::load(*(in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_>
                        **)child_ptr_val.tagged_ptr);
    nVar1 = basic_node_ptr<unodb::detail::node_header>::type(&local_68);
    if (nVar1 == LEAF) {
      this = basic_node_ptr<unodb::detail::node_header>::
             ptr<unodb::detail::basic_leaf<unsigned_long,unodb::detail::node_header>*>(&local_68);
      new_node._M_t.
      super___uniq_ptr_impl<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
      .
      super__Head_base<0UL,_unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_false>
      ._M_head_impl =
           (inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)
           inode_local;
      bVar2 = basic_leaf<unsigned_long,_unodb::detail::node_header>::matches
                        (this,(art_key_type)inode_local);
      if (bVar2) {
        bVar2 = basic_inode<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>,_49U,_256U,_(unodb::node_type)4,_unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::fake_inode,_unodb::detail::inode_256<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                ::is_min_size(&pbStack_28->
                               super_basic_inode_256_parent<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                             );
        if (bVar2) {
          basic_inode<unodb::detail::basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>,17u,48u,(unodb::node_type)3,unodb::detail::inode_16<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>,unodb::detail::inode_256<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>,unodb::detail::inode_48<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
          ::
          create<unodb::detail::inode_256<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>&,unsigned_char_const&>
                    ((basic_inode<unodb::detail::basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>,17u,48u,(unodb::node_type)3,unodb::detail::inode_16<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>,unodb::detail::inode_256<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>,unodb::detail::inode_48<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
                      *)local_90,(db_type *)node_in_parent_local,
                     (inode_256<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>
                      *)pbStack_28,args_1);
          ptr = (header_type *)
                std::
                unique_ptr<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                ::release((unique_ptr<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                           *)local_90);
          basic_node_ptr<unodb::detail::node_header>::basic_node_ptr(&local_98,ptr,I48);
          local_40->tagged_ptr = local_98.tagged_ptr;
          std::
          unique_ptr<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
          ::~unique_ptr((unique_ptr<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                         *)local_90);
          db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
          account_shrinking_inode<(unodb::node_type)4>
                    ((db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)
                     node_in_parent_local);
          local_a0 = (void *)0x0;
          std::optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>::
          optional<std::nullptr_t,_true>
                    ((optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*> *)
                     &k_local,&local_a0);
          uVar3 = extraout_RDX_02;
        }
        else {
          basic_inode_256<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
          ::remove(pbStack_28,(char *)(ulong)*args_1);
          local_a8 = (void *)0x0;
          std::optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>::
          optional<std::nullptr_t,_true>
                    ((optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*> *)
                     &k_local,&local_a8);
          uVar3 = extraout_RDX_03;
        }
      }
      else {
        std::optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>::optional
                  ((optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*> *)&k_local
                  );
        uVar3 = extraout_RDX_01;
      }
    }
    else {
      leaf = (basic_leaf<unsigned_long,_unodb::detail::node_header> *)
             unwrap_fake_critical_section
                       (*(in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_>
                          **)child_ptr_val.tagged_ptr);
      std::optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>::
      optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true>
                ((optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*> *)&k_local,
                 (basic_node_ptr<unodb::detail::node_header> **)&leaf);
      uVar3 = extraout_RDX_00;
    }
  }
  oVar5.
  super__Optional_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true>.
  _M_payload.
  super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>._9_7_ =
       (undefined7)((ulong)uVar3 >> 8);
  oVar5.
  super__Optional_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true>.
  _M_payload.
  super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>.
  _M_engaged = local_10;
  oVar5.
  super__Optional_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true>.
  _M_payload.
  super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>.
  _M_payload = (_Storage<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true>)
               k_local.field_0;
  return (optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>)
         oVar5.
         super__Optional_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true>
         ._M_payload.
         super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>;
}

Assistant:

std::optional<detail::node_ptr*> impl_helpers::remove_or_choose_subtree(
    INode& inode, std::byte key_byte, basic_art_key<Key> k,
    db<Key, Value>& db_instance, detail::node_ptr* node_in_parent) {
  const auto [child_i, child_ptr]{inode.find_child(key_byte)};

  if (child_ptr == nullptr) return {};

  const auto child_ptr_val{child_ptr->load()};
  if (child_ptr_val.type() != node_type::LEAF)
    return unwrap_fake_critical_section(child_ptr);

  const auto* const leaf{
      child_ptr_val.template ptr<typename db<Key, Value>::leaf_type*>()};
  if (!leaf->matches(k)) return {};

  if (UNODB_DETAIL_UNLIKELY(inode.is_min_size())) {
    if constexpr (std::is_same_v<INode, inode_4<Key, Value>>) {
      auto current_node{art_policy<Key, Value>::make_db_inode_unique_ptr(
          &inode, db_instance)};
      *node_in_parent = current_node->leave_last_child(child_i, db_instance);
    } else {
      auto new_node{
          INode::smaller_derived_type::create(db_instance, inode, child_i)};
      *node_in_parent =
          node_ptr{new_node.release(), INode::smaller_derived_type::type};
    }
#ifdef UNODB_DETAIL_WITH_STATS
    db_instance.template account_shrinking_inode<INode::type>();
#endif  // UNODB_DETAIL_WITH_STATS
    return nullptr;
  }

  inode.remove(child_i, db_instance);
  return nullptr;
}